

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

Value __thiscall xmrig::String::toJSON(String *this,Document *doc)

{
  Number s;
  long in_RDX;
  long extraout_RDX;
  Value VVar1;
  
  s = (doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.n;
  if ((Ch *)s.i64 == (Ch *)0x0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(Ch *)s,*(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10));
    in_RDX = extraout_RDX;
  }
  VVar1.data_.s.str = (Ch *)in_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::String::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    return isNull() ? Value(kNullType) : Value(m_data, doc.GetAllocator());
}